

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::Col<3>::idct(uint8 *pDst_ptr,int *pTemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RSI;
  undefined1 *in_RDI;
  int tmp0;
  int tmp3;
  int tmp2;
  int z1;
  int z3;
  int z2;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  int i;
  int btmp3;
  int btmp2;
  int btmp1;
  int btmp0;
  int az4;
  int az3;
  int az2;
  int az1;
  int bz5;
  int bz4;
  int bz3;
  int bz2;
  int bz1;
  int atmp3;
  int atmp2;
  int atmp1;
  int atmp0;
  int tmp12;
  int tmp11;
  int tmp13;
  int tmp10;
  int tmp1;
  
  iVar1 = in_RSI[0x10];
  iVar2 = *in_RSI * 0x2000 + iVar1 * 0x29cf;
  iVar3 = *in_RSI * 0x2000 + iVar1 * -0x29cf;
  iVar4 = *in_RSI * 0x2000 + iVar1 * 0x1151;
  iVar5 = *in_RSI * 0x2000 + iVar1 * -0x1151;
  iVar1 = in_RSI[8];
  local_88 = iVar2 + iVar1 * 0x2c63 + 0x2020000 >> 0x12;
  if (0xff < local_88) {
    local_88 = (int)(local_88 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  *in_RDI = (char)local_88;
  local_8c = iVar2 + iVar1 * -0x2c63 + 0x2020000 >> 0x12;
  if (0xff < local_8c) {
    local_8c = (int)(local_8c ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x38] = (char)local_8c;
  local_90 = iVar4 + iVar1 * 0x25a1 + 0x2020000 >> 0x12;
  if (0xff < local_90) {
    local_90 = (int)(local_90 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[8] = (char)local_90;
  local_94 = iVar4 + iVar1 * -0x25a1 + 0x2020000 >> 0x12;
  if (0xff < local_94) {
    local_94 = (int)(local_94 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x30] = (char)local_94;
  local_98 = iVar5 + iVar1 * 0x1925 + 0x2020000 >> 0x12;
  if (0xff < local_98) {
    local_98 = (int)(local_98 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x10] = (char)local_98;
  local_9c = iVar5 + iVar1 * -0x1925 + 0x2020000 >> 0x12;
  if (0xff < local_9c) {
    local_9c = (int)(local_9c ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x28] = (char)local_9c;
  local_a0 = iVar3 + iVar1 * 0x8d4 + 0x2020000 >> 0x12;
  if (0xff < local_a0) {
    local_a0 = (int)(local_a0 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x18] = (char)local_a0;
  local_a4 = iVar3 + iVar1 * -0x8d4 + 0x2020000 >> 0x12;
  if (0xff < local_a4) {
    local_a4 = (int)(local_a4 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  in_RDI[0x20] = (char)local_a4;
  return;
}

Assistant:

static void idct(uint8* pDst_ptr, const int* pTemp) {
// ACCESS_ROW() will be optimized at compile time to either an array access, or 0.
#define ACCESS_ROW(x) (((x) < NONZERO_ROWS) ? pTemp[x * 8] : 0)

    const int z2 = ACCESS_ROW(2);
    const int z3 = ACCESS_ROW(6);

    const int z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    const int tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    const int tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    const int tmp0 = (ACCESS_ROW(0) + ACCESS_ROW(4)) << CONST_BITS;
    const int tmp1 = (ACCESS_ROW(0) - ACCESS_ROW(4)) << CONST_BITS;

    const int tmp10 = tmp0 + tmp3, tmp13 = tmp0 - tmp3, tmp11 = tmp1 + tmp2, tmp12 = tmp1 - tmp2;

    const int atmp0 = ACCESS_ROW(7), atmp1 = ACCESS_ROW(5), atmp2 = ACCESS_ROW(3), atmp3 = ACCESS_ROW(1);

    const int bz1 = atmp0 + atmp3, bz2 = atmp1 + atmp2, bz3 = atmp0 + atmp2, bz4 = atmp1 + atmp3;
    const int bz5 = MULTIPLY(bz3 + bz4, FIX_1_175875602);

    const int az1 = MULTIPLY(bz1, -FIX_0_899976223);
    const int az2 = MULTIPLY(bz2, -FIX_2_562915447);
    const int az3 = MULTIPLY(bz3, -FIX_1_961570560) + bz5;
    const int az4 = MULTIPLY(bz4, -FIX_0_390180644) + bz5;

    const int btmp0 = MULTIPLY(atmp0, FIX_0_298631336) + az1 + az3;
    const int btmp1 = MULTIPLY(atmp1, FIX_2_053119869) + az2 + az4;
    const int btmp2 = MULTIPLY(atmp2, FIX_3_072711026) + az2 + az3;
    const int btmp3 = MULTIPLY(atmp3, FIX_1_501321110) + az1 + az4;

    int i = DESCALE_ZEROSHIFT(tmp10 + btmp3, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 0] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp10 - btmp3, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 7] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp11 + btmp2, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 1] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp11 - btmp2, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 6] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp12 + btmp1, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 2] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp12 - btmp1, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 5] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp13 + btmp0, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 3] = (uint8)CLAMP(i);

    i = DESCALE_ZEROSHIFT(tmp13 - btmp0, CONST_BITS + PASS1_BITS + 3);
    pDst_ptr[8 * 4] = (uint8)CLAMP(i);
  }